

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint8_t __thiscall Cache::getByteCopy(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  uint32_t offset_1;
  uint32_t offset;
  int block_id;
  uint32_t *in_stack_00000090;
  uint32_t in_stack_0000009c;
  Cache *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t local_1;
  
  uVar1 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd4);
  if (uVar1 == 0xffffffff) {
    loadBlockFromLowerLevel(in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
    uVar1 = getBlockId((Cache *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4)
    ;
    if (uVar1 == 0xffffffff) {
      fprintf(_stderr,"Error, data should in top level cache, but it seems not\n");
      exit(-1);
    }
    uVar2 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (uint32_t)((ulong)in_RDI >> 0x20));
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                        (long)(int)uVar1);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar3->data,(ulong)uVar2);
    local_1 = *pvVar4;
  }
  else {
    uVar2 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (uint32_t)((ulong)in_RDI >> 0x20));
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                        (long)(int)uVar1);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar3->data,(ulong)uVar2);
    local_1 = *pvVar4;
  }
  return local_1;
}

Assistant:

uint8_t Cache::getByteCopy(uint32_t addr, uint32_t *cycles) {
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        // in cache
        uint32_t offset = this->getOffset(addr);
        return this->blocks[block_id].data[offset];
    }
    this->loadBlockFromLowerLevel(addr, cycles);
    if ((block_id = this->getBlockId(addr)) != -1) {
        uint32_t offset = this->getOffset(addr);
        return this->blocks[block_id].data[offset];
    } else {
        fprintf(stderr, "Error, data should in top level cache, but it seems not\n");
        exit(-1);
    }
}